

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  size_t sVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  pointer pbVar7;
  char *pcVar8;
  initializer_list<cv::Mat> __l;
  json j;
  Mat img0;
  OpticalFlowFrameToFrame<float,_vo::Pattern51> flow;
  char dataset1 [68];
  char dataset0 [68];
  Mat img1;
  allocator_type local_3c1;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_3c0;
  undefined1 local_3a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  long local_388 [2];
  long *local_378 [2];
  long local_368 [2];
  SE3f local_358 [3];
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_2f0;
  undefined1 local_2d8 [20];
  float local_2c4;
  Index local_2c0;
  undefined4 local_2b8;
  Mat local_278 [96];
  undefined1 local_218 [12];
  undefined4 local_20c;
  pointer local_208;
  float local_200;
  undefined4 uStack_1fc;
  Index local_1f8;
  undefined4 local_1f0;
  undefined4 local_1ec;
  int64_t local_1e8;
  float local_1e0;
  undefined4 local_1dc;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  char local_128 [64];
  undefined4 local_e8;
  char local_d8 [64];
  undefined4 local_98;
  string local_90 [96];
  
  pcVar6 = "/home/powei/Documents/dataset/EuRoC/V1_01_easy/mav0/cam0/data/*.png";
  pcVar8 = local_d8;
  for (lVar4 = 8; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)pcVar8 = *(undefined8 *)pcVar6;
    pcVar6 = pcVar6 + 8;
    pcVar8 = pcVar8 + 8;
  }
  local_98 = 0x676e70;
  pcVar6 = "/home/powei/Documents/dataset/EuRoC/V1_01_easy/mav0/cam1/data/*.png";
  pcVar8 = local_128;
  for (lVar4 = 8; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)pcVar8 = *(undefined8 *)pcVar6;
    pcVar6 = pcVar6 + 8;
    pcVar8 = pcVar8 + 8;
  }
  local_e8 = 0x676e70;
  local_3c0.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
  local_3c0.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_3c0.
       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 2;
  ((local_3c0.
    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_3c0.
    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_3c0.
    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c0.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c0.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c0.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c0.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_3c0.
       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_378[0] = local_368;
  sVar2 = strlen(local_d8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,local_d8,local_d8 + sVar2);
  cv::glob(local_378,
           local_3c0.
           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start,0);
  if (local_378[0] != local_368) {
    operator_delete(local_378[0],local_368[0] + 1);
  }
  local_398._M_allocated_capacity = (size_type)local_388;
  sVar2 = strlen(local_128);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,local_128,local_128 + sVar2);
  cv::glob(&local_398,
           local_3c0.
           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1,0);
  if ((long *)local_398._M_allocated_capacity != local_388) {
    operator_delete((void *)local_398._M_allocated_capacity,local_388[0] + 1);
  }
  local_218._0_8_ = (pointer)&local_208;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_218,"../data/euroc_ds_calib.json","");
  fromFile((string *)local_3a8);
  if ((pointer)local_218._0_8_ != (pointer)&local_208) {
    operator_delete((void *)local_218._0_8_,(ulong)&(local_208->_M_t)._M_impl.field_0x1);
  }
  T_1_0(local_358,(json *)local_3a8);
  Sophus::SO3Base<Sophus::SO3<float,_0>_>::matrix((SO3Base<Sophus::SO3<float,_0>_> *)local_358);
  local_218._0_8_ = local_2d8._0_8_;
  local_218._8_4_ = local_2d8._8_4_;
  local_208 = (pointer)local_2d8._12_8_;
  local_200 = local_2c4;
  local_1f8 = local_2c0;
  local_1f0 = local_2b8;
  local_1e8._0_4_ =
       local_358[0].translation_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[0];
  local_1e8._4_4_ =
       local_358[0].translation_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[1];
  local_1e0 = local_358[0].translation_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[2];
  local_20c = 0;
  uStack_1fc = 0;
  local_1ec = 0;
  local_1dc = 0x3f800000;
  poVar3 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_218);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  T_1_0(local_358,(json *)local_3a8);
  Sophus::SE3Base<Sophus::SE3<float,_0>_>::inverse
            ((SE3<float,_0> *)local_2d8,(SE3Base<Sophus::SE3<float,_0>_> *)local_358);
  vo::OpticalFlowFrameToFrame<float,_vo::Pattern51>::OpticalFlowFrameToFrame
            ((OpticalFlowFrameToFrame<float,_vo::Pattern51> *)local_218,'\x02',(SE3 *)local_2d8);
  pbVar7 = ((local_3c0.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((local_3c0.
        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar7) {
    uVar5 = 0;
    do {
      iVar1 = (int)(uVar5 << 5);
      cv::imread((string *)local_358,(int)pbVar7 + iVar1);
      cv::imread(local_90,iVar1 + (int)local_3c0.
                                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
      cv::Mat::Mat((Mat *)local_2d8,(Mat *)local_358);
      cv::Mat::Mat(local_278,(Mat *)local_90);
      __l._M_len = 2;
      __l._M_array = (Mat *)local_2d8;
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector(&local_2f0,__l,&local_3c1);
      vo::OpticalFlowFrameToFrame<float,_vo::Pattern51>::processFrame
                ((OpticalFlowFrameToFrame<float,_vo::Pattern51> *)local_218,&local_2f0);
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_2f0);
      lVar4 = 0x60;
      do {
        cv::Mat::~Mat((Mat *)(local_2d8 + lVar4));
        lVar4 = lVar4 + -0x60;
      } while (lVar4 != -0x60);
      cv::waitKey(1);
      cv::Mat::~Mat((Mat *)local_90);
      cv::Mat::~Mat((Mat *)local_358);
      uVar5 = uVar5 + 1;
      pbVar7 = ((local_3c0.
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)((local_3c0.
                                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5))
    ;
  }
  if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
  }
  if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
  }
  if (local_198._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_198._M_pi);
  }
  free((void *)CONCAT44(uStack_1fc,local_200));
  std::
  vector<std::map<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::less<unsigned_long>,_Eigen::aligned_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>_>,_std::allocator<std::map<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::less<unsigned_long>,_Eigen::aligned_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>_>_>_>
  ::~vector((vector<std::map<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::less<unsigned_long>,_Eigen::aligned_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>_>,_std::allocator<std::map<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::less<unsigned_long>,_Eigen::aligned_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>_>_>_>
             *)local_218);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_3a8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::json_value::destroy((json_value *)(local_3a8 + 8),local_3a8[0]);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_3c0);
  return 0;
}

Assistant:

int main() {
  constexpr char dataset0[] =
      "/home/powei/Documents/dataset/EuRoC/V1_01_easy/mav0/cam0/data/*.png";
  constexpr char dataset1[] =
      "/home/powei/Documents/dataset/EuRoC/V1_01_easy/mav0/cam1/data/*.png";
  // constexpr char dataset[] = "/Users/powei/Documents/mav0/cam0/data/*.png";
  vector<vector<string>> filenames(2);
  glob(dataset0, filenames[0]);
  glob(dataset1, filenames[1]);
  const nlohmann::json j = fromFile("../data/euroc_ds_calib.json");
  cout << T_1_0(j).matrix() << endl;

  vo::OpticalFlowFrameToFrame<float, vo::Pattern51> flow(2, T_1_0(j).inverse());

  for (size_t i = 0; i < filenames[0].size(); i++) {
    Mat img0 = imread(filenames[0][i], cv::IMREAD_UNCHANGED);
    Mat img1 = imread(filenames[1][i], cv::IMREAD_UNCHANGED);
    flow.processFrame({img0, img1});
    waitKey(1);
    // if(i>1000)
    //   break;
  }
  return 0;
}